

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.cpp
# Opt level: O2

void CVmBif::get_str_val_buf(char *buf,size_t buflen,vm_val_t *val)

{
  ushort *puVar1;
  size_t __n;
  
  puVar1 = (ushort *)get_str_val(val);
  __n = (size_t)*puVar1;
  if (buflen - 1 < __n) {
    __n = utf8_ptr::s_trunc((char *)(puVar1 + 1),buflen - 1);
  }
  memcpy(buf,puVar1 + 1,__n);
  buf[__n] = '\0';
  return;
}

Assistant:

void CVmBif::get_str_val_buf(VMG_ char *buf, size_t buflen,
                             const vm_val_t *val)
{
    /* pop the string value */
    const char *strp = get_str_val(vmg_ val);

    /* 
     *   get the length, but limit it to our buffer size, less one byte
     *   for null termination 
     */
    size_t copy_len = vmb_get_len(strp);
    if (copy_len > buflen - 1)
        copy_len = utf8_ptr::s_trunc(strp + VMB_LEN, buflen - 1);

    /* copy the string */
    memcpy(buf, strp + VMB_LEN, copy_len);

    /* null-terminate the result */
    buf[copy_len] = '\0';
}